

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::JsonTranslatorOperator::convertToMessage(JsonTranslatorOperator *this,SmallBuffer *value)

{
  _func_int *__src;
  _func_int **__s;
  long in_RDX;
  pointer *__ptr;
  SmallBuffer sb;
  defV val;
  undefined1 local_b8 [16];
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  _func_int *local_78;
  _func_int *local_68;
  bool local_60;
  bool local_5e;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_58;
  undefined1 local_30;
  
  local_58._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
  local_30 = 0;
  local_b8._0_8_ = *(size_t *)(in_RDX + 0x40);
  local_b8._8_8_ = *(undefined8 *)(in_RDX + 0x50);
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  helics::valueExtract((data_view *)local_b8,HELICS_ANY,(defV *)&local_58._M_first);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  typeConvertDefV((SmallBuffer *)local_b8,HELICS_JSON,(defV *)&local_58._M_first);
  __s = (_func_int **)operator_new(0x100);
  memset(__s,0,0x100);
  __src = local_68;
  __s[0xb] = (_func_int *)0x40;
  __s[0xc] = (_func_int *)(__s + 2);
  __s[0xd] = (_func_int *)0x0;
  __s[0xe] = (_func_int *)(__s + 0x10);
  __s[0xf] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x10) = 0;
  __s[0x12] = (_func_int *)(__s + 0x14);
  __s[0x13] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x14) = 0;
  __s[0x16] = (_func_int *)(__s + 0x18);
  __s[0x17] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x18) = 0;
  __s[0x1a] = (_func_int *)(__s + 0x1c);
  __s[0x1b] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x1c) = 0;
  *(undefined4 *)(__s + 0x1e) = 0;
  __s[0x1f] = (_func_int *)0x0;
  (this->super_TranslatorOperator)._vptr_TranslatorOperator = __s;
  if (local_68 == __s[0xc]) {
    __s[10] = local_78;
  }
  else {
    SmallBuffer::reserve((SmallBuffer *)(__s + 2),(size_t)local_78);
    __s[10] = local_78;
    if (local_78 != (_func_int *)0x0) {
      memcpy(__s[0xc],__src,(size_t)local_78);
    }
  }
  if (((local_5e == true) && (local_60 == false)) && (local_68 != (_func_int *)0x0)) {
    operator_delete__(local_68);
  }
  std::__detail::__variant::
  _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)&local_58._M_first);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> JsonTranslatorOperator::convertToMessage(const SmallBuffer& value)
{
    defV val;
    valueExtract(value, DataType::HELICS_ANY, val);
    auto sb = typeConvertDefV(DataType::HELICS_JSON, val);
    auto m = std::make_unique<Message>();
    m->data = sb.to_string();
    return m;
}